

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ThrowTypeErrorOrFalse(JSContext *ctx,int flags,char *fmt,...)

{
  BOOL BVar1;
  char *in_RCX;
  uint in_ESI;
  JSContext *in_RDI;
  undefined8 in_R8;
  JSContext *in_R9;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff18;
  JSErrorEnum error_num;
  int local_4;
  
  error_num = (JSErrorEnum)((ulong)in_R8 >> 0x20);
  if (((in_ESI & 0x4000) == 0) &&
     (((in_ESI & 0x8000) == 0 || (BVar1 = is_strict_mode(in_RDI), BVar1 == 0)))) {
    local_4 = 0;
  }
  else {
    JS_ThrowError(in_R9,error_num,in_RCX,in_stack_ffffffffffffff18);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int __attribute__((format(printf, 3, 4))) JS_ThrowTypeErrorOrFalse(JSContext *ctx, int flags, const char *fmt, ...)
{
    va_list ap;

    if ((flags & JS_PROP_THROW) ||
        ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
        va_start(ap, fmt);
        JS_ThrowError(ctx, JS_TYPE_ERROR, fmt, ap);
        va_end(ap);
        return -1;
    } else {
        return FALSE;
    }
}